

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_generator.hpp
# Opt level: O2

void __thiscall
ranger::bhvr_tree::
xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>,true_node,false_node>
::generate_node(xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>,true_node,false_node>
                *this)

{
  long in_RSI;
  
  xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
  ::generate_node((xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
                   *)this,in_RSI + -0x20);
  return;
}

Assistant:

node_pointer generate_node(rapidxml::xml_node<>* data,
                             generate_node_type<parallel_hybrid_node<AgentProxy>>) const final {
    size_t count = 0;
    bool expected = false;

    auto attr = data->first_attribute("count");
    if (attr) {
      char* end;
      count = strtoul(attr->value(), &end, 10);
    }

    attr = data->first_attribute("expected");
    if (attr && strcmp(attr->value(), "true") == 0) {
      expected = true;
    }

    return node_pointer(new parallel_hybrid_node<AgentProxy>(count, expected));
  }